

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O3

InstanceSymbol *
slang::ast::InstanceSymbol::createVirtual
          (ASTContext *context,SourceLocation loc,DefinitionSymbol *definition,
          ParameterValueAssignmentSyntax *paramAssignments)

{
  Compilation *args;
  span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL> parameterDecls;
  InstanceSymbol *pIVar1;
  ParameterBuilder paramBuilder;
  InstanceFlags local_1c1;
  SourceLocation local_1c0;
  undefined1 local_1b8 [320];
  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
  local_78;
  ASTContext *local_48;
  
  parameterDecls._M_ptr =
       (definition->parameters).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.
       data_;
  parameterDecls._M_extent._M_extent_value =
       (definition->parameters).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.
       len;
  local_1c0 = loc;
  ParameterBuilder::ParameterBuilder
            ((ParameterBuilder *)local_1b8,(context->scope).ptr,(definition->super_Symbol).name,
             parameterDecls);
  local_48 = context;
  if (paramAssignments != (ParameterValueAssignmentSyntax *)0x0) {
    ParameterBuilder::setAssignments((ParameterBuilder *)local_1b8,paramAssignments,false);
  }
  args = ((context->scope).ptr)->compilation;
  local_1c1 = None;
  pIVar1 = BumpAllocator::
           emplace<slang::ast::InstanceSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation&,slang::ast::DefinitionSymbol_const&,slang::ast::ParameterBuilder&,slang::ast::InstanceFlags>
                     (&args->super_BumpAllocator,args,&(definition->super_Symbol).name,&local_1c0,
                      definition,(ParameterBuilder *)local_1b8,&local_1c1);
  (pIVar1->super_InstanceSymbolBase).super_Symbol.parentScope = (context->scope).ptr;
  boost::unordered::detail::foa::
  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
  ::delete_((allocator_type)local_1b8._312_8_,&local_78);
  return pIVar1;
}

Assistant:

InstanceSymbol& InstanceSymbol::createVirtual(
    const ASTContext& context, SourceLocation loc, const DefinitionSymbol& definition,
    const ParameterValueAssignmentSyntax* paramAssignments) {

    ParameterBuilder paramBuilder(*context.scope, definition.name, definition.parameters);
    paramBuilder.setInstanceContext(context);
    if (paramAssignments)
        paramBuilder.setAssignments(*paramAssignments, /* isFromConfig */ false);

    auto& comp = context.getCompilation();
    auto& result = *comp.emplace<InstanceSymbol>(comp, definition.name, loc, definition,
                                                 paramBuilder, InstanceFlags::None);

    // Set the parent pointer so that traversing upwards still works to find
    // the instantiation scope. This "virtual" instance never actually gets
    // added to the scope the proper way as a member.
    result.setParent(*context.scope);
    return result;
}